

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_verify.cpp
# Opt level: O1

uint GetLegacySigOpCount(CTransaction *tx)

{
  long lVar1;
  pointer pCVar2;
  pointer pCVar3;
  uint uVar4;
  uint uVar5;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1;
  CTxIn *txin;
  pointer pCVar6;
  pointer pCVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar5 = 0;
  for (pCVar6 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start; pCVar6 != pCVar2; pCVar6 = pCVar6 + 1) {
    uVar4 = CScript::GetSigOpCount(&pCVar6->scriptSig,false);
    uVar5 = uVar5 + uVar4;
  }
  pCVar3 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pCVar7 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start; pCVar7 != pCVar3; pCVar7 = pCVar7 + 1) {
    uVar4 = CScript::GetSigOpCount(&pCVar7->scriptPubKey,false);
    uVar5 = uVar5 + uVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar5;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int GetLegacySigOpCount(const CTransaction& tx)
{
    unsigned int nSigOps = 0;
    for (const auto& txin : tx.vin)
    {
        nSigOps += txin.scriptSig.GetSigOpCount(false);
    }
    for (const auto& txout : tx.vout)
    {
        nSigOps += txout.scriptPubKey.GetSigOpCount(false);
    }
    return nSigOps;
}